

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O2

stringpiece_ssize_type __thiscall
google::protobuf::StringPiece::find_first_not_of(StringPiece *this,char c,size_type pos)

{
  ulong uVar1;
  
  uVar1 = 0xffffffffffffffff;
  if (0 < this->length_) {
    for (; (uVar1 = 0xffffffffffffffff, pos < (ulong)this->length_ &&
           (uVar1 = pos, this->ptr_[pos] == c)); pos = pos + 1) {
    }
  }
  return uVar1;
}

Assistant:

stringpiece_ssize_type StringPiece::find_first_not_of(char c,
                                                      size_type pos) const {
  if (length_ <= 0) return npos;

  for (; pos < static_cast<size_type>(length_); ++pos) {
    if (ptr_[pos] != c) {
      return pos;
    }
  }
  return npos;
}